

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O0

void Aig_RManStop(Aig_RMan_t *p)

{
  uint local_14;
  int i;
  Aig_RMan_t *p_local;
  
  printf("Total funcs    = %10d\n",(ulong)(uint)p->nTotal);
  printf("Full DSD funcs = %10d\n",(ulong)(uint)p->nTtDsd);
  printf("Part DSD funcs = %10d\n",(ulong)(uint)p->nTtDsdPart);
  printf("Non- DSD funcs = %10d\n",(ulong)(uint)p->nTtDsdNot);
  printf("Uniq-var funcs = %10d\n",(ulong)(uint)p->nUniqueVars);
  printf("Unique   funcs = %10d\n");
  printf("Distribution of functions:\n");
  for (local_14 = 5; (int)local_14 <= p->nVars; local_14 = local_14 + 1) {
    printf("%2d = %8d\n",(ulong)local_14,(ulong)(uint)p->nVarFuncs[(int)local_14]);
  }
  Aig_MmFlexStop(p->pMemTrus,0);
  Aig_ManStop(p->pAig);
  Bdc_ManFree(p->pBidec);
  if (p->pBins != (Aig_Tru_t **)0x0) {
    free(p->pBins);
    p->pBins = (Aig_Tru_t **)0x0;
  }
  if (p != (Aig_RMan_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Aig_RManStop( Aig_RMan_t * p )
{
    int i;
    printf( "Total funcs    = %10d\n", p->nTotal );
    printf( "Full DSD funcs = %10d\n", p->nTtDsd );
    printf( "Part DSD funcs = %10d\n", p->nTtDsdPart );
    printf( "Non- DSD funcs = %10d\n", p->nTtDsdNot );
    printf( "Uniq-var funcs = %10d\n", p->nUniqueVars );
    printf( "Unique   funcs = %10d\n", p->nEntries );
    printf( "Distribution of functions:\n" );
    for ( i = 5; i <= p->nVars; i++ )
        printf( "%2d = %8d\n", i, p->nVarFuncs[i] );
    Aig_MmFlexStop( p->pMemTrus, 0 );
    Aig_ManStop( p->pAig );
    Bdc_ManFree( p->pBidec );
    ABC_FREE( p->pBins );
    ABC_FREE( p );
}